

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_precomputed_adjacency_list.h
# Opt level: O2

void __thiscall
AdjacencyListSBPLEnv<Point2D>::addPoint(AdjacencyListSBPLEnv<Point2D> *this,Point2D *c)

{
  pointer pPVar1;
  pointer pPVar2;
  mapped_type *pmVar3;
  Adjacencies a;
  int *entry;
  
  pPVar1 = (this->points_).super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar2 = (this->points_).super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar3 = std::
           map<Point2D,_int,_std::less<Point2D>,_std::allocator<std::pair<const_Point2D,_int>_>_>::
           operator[](&this->pointIds_,c);
  *pmVar3 = (mapped_type)((ulong)((long)pPVar1 - (long)pPVar2) >> 3);
  a.super__List_base<Adjacency,_std::allocator<Adjacency>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&a;
  a.super__List_base<Adjacency,_std::allocator<Adjacency>_>._M_impl._M_node._M_size = 0;
  a.super__List_base<Adjacency,_std::allocator<Adjacency>_>._M_impl._M_node.super__List_node_base.
  _M_prev = a.super__List_base<Adjacency,_std::allocator<Adjacency>_>._M_impl._M_node.
            super__List_node_base._M_next;
  std::vector<Point2D,_std::allocator<Point2D>_>::push_back(&this->points_,c);
  std::
  vector<std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>,_std::allocator<std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>_>_>
  ::push_back(&this->adjacency_vector_,&a);
  entry = (int *)operator_new__(8);
  entry[0] = -1;
  entry[1] = -1;
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            (&(this->super_DiscreteSpaceInformation).StateID2IndexMapping,&entry);
  std::__cxx11::_List_base<Adjacency,_std::allocator<Adjacency>_>::_M_clear
            (&a.super__List_base<Adjacency,_std::allocator<Adjacency>_>);
  return;
}

Assistant:

void AdjacencyListSBPLEnv<Coords>::addPoint(const Coords& c)
{
    pointIds_[c] = points_.size();
    Adjacencies a;
    points_.push_back(c);
    adjacency_vector_.push_back(a);

    int* entry = new int[NUMOFINDICES_STATEID2IND];
    for (unsigned int i = 0; i < NUMOFINDICES_STATEID2IND; i++) {
        entry[i] = -1;
    }
    StateID2IndexMapping.push_back(entry);
}